

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void gen_absv_mask(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 b,uint vece)

{
  TCGTemp *a3;
  int64_t arg2;
  uintptr_t o_1;
  int iVar1;
  uintptr_t o;
  uintptr_t o_2;
  TCGv_i64 ret;
  
  arg2 = 0;
  a3 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)a3 - (long)tcg_ctx);
  iVar1 = 8 << ((byte)vece & 0x1f);
  tcg_gen_shri_i64_tricore(tcg_ctx,ret,b,(ulong)(iVar1 - 1));
  if (vece < 4) {
    arg2 = *(int64_t *)(&DAT_00d6d568 + (ulong)vece * 8);
  }
  tcg_gen_andi_i64_tricore(tcg_ctx,ret,ret,arg2);
  tcg_gen_muli_i64_tricore(tcg_ctx,ret,ret,(ulong)(uint)~(-1 << ((byte)iVar1 & 0x1f)));
  tcg_gen_op3_tricore(tcg_ctx,INDEX_op_xor_i64,(TCGArg)(d + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(b + (long)tcg_ctx),(TCGArg)a3);
  tcg_gen_sub_i64(tcg_ctx,d,d,ret);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_absv_mask(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 b, unsigned vece)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
    int nbit = 8 << vece;

    /* Create -1 for each negative element.  */
    tcg_gen_shri_i64(tcg_ctx, t, b, nbit - 1);
    tcg_gen_andi_i64(tcg_ctx, t, t, dup_const(vece, 1));
    tcg_gen_muli_i64(tcg_ctx, t, t, (1 << nbit) - 1);

    /*
     * Invert (via xor -1) and add one (via sub -1).
     * Because of the ordering the msb is cleared,
     * so we never have carry into the next element.
     */
    tcg_gen_xor_i64(tcg_ctx, d, b, t);
    tcg_gen_sub_i64(tcg_ctx, d, d, t);

    tcg_temp_free_i64(tcg_ctx, t);
}